

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O3

void uo_cb_thrdpool_quit(void)

{
  uo_cb *cb;
  ulong uVar1;
  long lVar2;
  
  is_quitting = 1;
  uo_cb_thrd_init();
  sem_post((sem_t *)&thrdpool.update_sem);
  pthread_join(thrdpool.manager_thrd,(void **)0x0);
  if (thrdpool.thrd_count != 0) {
    uVar1 = 0;
    do {
      cb = uo_cb_create();
      uo_cb_invoke_async(cb);
      uVar1 = uVar1 + 1;
    } while (uVar1 < thrdpool.thrd_count);
  }
  lVar2 = 0;
  do {
    if (*(int *)((long)&thrdpool.cb_thrds[0].state + lVar2) != 0) {
      pthread_join(*(pthread_t *)((long)&thrdpool.cb_thrds[0].thrd + lVar2),(void **)0x0);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x100);
  sem_destroy((sem_t *)&thrdpool.update_sem);
  uo_cb_thrd_quit();
  is_init = false;
  return;
}

Assistant:

static void uo_cb_thrdpool_quit(void)
{
    is_quitting = true;

    uo_cb_thrd_init();
    sem_post(&thrdpool.update_sem);

    pthread_join(thrdpool.manager_thrd, NULL);

    for (size_t i = 0; i < thrdpool.thrd_count; ++i)
        uo_cb_invoke_async(uo_cb_create());

    for (size_t i = 0; i < UO_CB_THRD_COUNT_MAX; ++i)
        if (thrdpool.cb_thrds[i].state)
            pthread_join(thrdpool.cb_thrds[i].thrd, NULL);

    sem_destroy(&thrdpool.update_sem);
    uo_cb_thrd_quit();

    is_init = false;
}